

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int fits_quantize_double
              (long row,double *fdata,long nxpix,long nypix,int nullcheck,double in_null_value,
              float qlevel,int dither_method,int *idata,double *bscale,double *bzero,int *iminval,
              int *imaxval)

{
  double dVar1;
  float *pfVar2;
  int iVar3;
  size_t sVar4;
  double *pdVar5;
  double *pdVar6;
  double *arr;
  double *__ptr;
  double *__base;
  double *__base_00;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  double *pdVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  long lVar18;
  size_t sVar19;
  long lVar20;
  size_t sVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  long local_b0;
  size_t local_98;
  size_t local_68;
  
  sVar21 = nypix * nxpix;
  if ((long)sVar21 < 2) {
    iVar3 = 0;
    dVar24 = 0.0;
    dVar35 = 1.0;
LAB_001a482a:
    *bscale = dVar35;
    *bzero = dVar24;
  }
  else {
    sVar8 = 1;
    if (0.0 <= qlevel) {
      sVar4 = sVar8;
      if (nxpix < 9) {
        sVar4 = nypix;
        nypix = sVar8;
      }
      sVar4 = sVar4 * nxpix;
      if ((long)sVar4 < 9) {
        sVar19 = 0;
        if ((long)sVar4 < 1) {
          sVar4 = sVar19;
        }
        dVar32 = -1.79769313486232e+308;
        dVar33 = 1.79769313486232e+308;
        for (sVar8 = 0; sVar4 != sVar8; sVar8 = sVar8 + 1) {
          dVar35 = fdata[sVar8];
          uVar22 = SUB84(dVar35,0);
          uVar23 = (undefined4)((ulong)dVar35 >> 0x20);
          if (nullcheck == 0) {
LAB_001a39c5:
            dVar24 = dVar35;
            if (dVar33 <= dVar35) {
              dVar24 = dVar33;
            }
            dVar33 = dVar24;
            if (dVar35 <= dVar32) {
              uVar22 = SUB84(dVar32,0);
              uVar23 = (undefined4)((ulong)dVar32 >> 0x20);
            }
            sVar19 = sVar19 + 1;
            dVar32 = (double)CONCAT44(uVar23,uVar22);
          }
          else if ((dVar35 != in_null_value) || (NAN(dVar35) || NAN(in_null_value)))
          goto LAB_001a39c5;
        }
LAB_001a4424:
        dVar35 = 0.0;
        dVar24 = 0.0;
        dVar31 = 0.0;
      }
      else {
        pdVar5 = (double *)calloc(sVar4,8);
        dVar35 = 0.0;
        dVar24 = 0.0;
        dVar31 = 0.0;
        if (pdVar5 != (double *)0x0) {
          pdVar6 = (double *)calloc(sVar4,8);
          if (pdVar6 != (double *)0x0) {
            arr = (double *)calloc(sVar4,8);
            if (arr == (double *)0x0) {
              free(pdVar5);
              pdVar5 = pdVar6;
            }
            else {
              __ptr = (double *)calloc(nypix,8);
              if (__ptr == (double *)0x0) {
                free(pdVar5);
                free(pdVar6);
                pdVar5 = arr;
              }
              else {
                __base = (double *)calloc(nypix,8);
                if (__base == (double *)0x0) {
                  free(pdVar5);
                  free(pdVar6);
                  free(arr);
                  pdVar5 = __ptr;
                }
                else {
                  __base_00 = (double *)calloc(nypix,8);
                  if (__base_00 != (double *)0x0) {
                    sVar19 = 0;
                    if (nypix < 1) {
                      nypix = sVar19;
                    }
                    dVar32 = -1.79769313486232e+308;
                    dVar33 = 1.79769313486232e+308;
                    local_98 = 0;
                    local_68 = 0;
                    pdVar14 = fdata;
                    for (sVar8 = 0; sVar8 != nypix; sVar8 = sVar8 + 1) {
                      sVar15 = 0;
                      if (nullcheck == 0) {
LAB_001a3cea:
                        if (sVar15 != sVar4) {
                          sVar16 = sVar15 + 1;
                          sVar9 = sVar16;
                          if (nullcheck != 0) {
                            sVar7 = sVar16;
                            if (sVar4 - sVar16 != 0 && (long)sVar16 <= (long)sVar4) {
                              sVar7 = sVar4;
                            }
                            for (; sVar9 = sVar7, (long)sVar16 < (long)sVar4; sVar16 = sVar16 + 1) {
                              sVar9 = sVar16;
                              if ((pdVar14[sVar16] != in_null_value) ||
                                 (NAN(pdVar14[sVar16]) || NAN(in_null_value))) break;
                            }
                          }
                          lVar18 = sVar8 * sVar4;
                          dVar35 = fdata[lVar18 + sVar15];
                          uVar22 = SUB84(dVar35,0);
                          uVar23 = (undefined4)((ulong)dVar35 >> 0x20);
                          dVar24 = dVar35;
                          if (dVar33 <= dVar35) {
                            dVar24 = dVar33;
                          }
                          if (dVar35 <= dVar32) {
                            dVar35 = dVar32;
                          }
                          if (sVar9 == sVar4) {
                            sVar19 = sVar19 + 1;
                            dVar32 = dVar35;
                            dVar33 = dVar24;
                          }
                          else {
                            sVar15 = sVar9 + 1;
                            sVar16 = sVar15;
                            if (nullcheck != 0) {
                              sVar7 = sVar15;
                              if (sVar4 - sVar15 != 0 && (long)sVar15 <= (long)sVar4) {
                                sVar7 = sVar4;
                              }
                              for (; sVar16 = sVar7, (long)sVar15 < (long)sVar4; sVar15 = sVar15 + 1
                                  ) {
                                sVar16 = sVar15;
                                if ((pdVar14[sVar15] != in_null_value) ||
                                   (NAN(pdVar14[sVar15]) || NAN(in_null_value))) break;
                              }
                            }
                            dVar31 = fdata[lVar18 + sVar9];
                            auVar25._8_8_ = 0;
                            auVar25._0_8_ = dVar31;
                            uVar27 = SUB84(dVar31,0);
                            uVar29 = (undefined4)((ulong)dVar31 >> 0x20);
                            uVar28 = uVar27;
                            uVar30 = uVar29;
                            if (dVar24 <= dVar31) {
                              uVar28 = SUB84(dVar24,0);
                              uVar30 = (undefined4)((ulong)dVar24 >> 0x20);
                            }
                            if (dVar31 <= dVar35) {
                              uVar27 = SUB84(dVar35,0);
                              uVar29 = (undefined4)((ulong)dVar35 >> 0x20);
                            }
                            if (sVar16 == sVar4) {
                              sVar19 = sVar19 + 2;
                              dVar32 = (double)CONCAT44(uVar29,uVar27);
                              dVar33 = (double)CONCAT44(uVar30,uVar28);
                            }
                            else {
                              sVar15 = sVar16 + 1;
                              sVar9 = sVar15;
                              if (nullcheck != 0) {
                                sVar7 = sVar15;
                                if (sVar4 - sVar15 != 0 && (long)sVar15 <= (long)sVar4) {
                                  sVar7 = sVar4;
                                }
                                for (; sVar9 = sVar7, (long)sVar15 < (long)sVar4;
                                    sVar15 = sVar15 + 1) {
                                  sVar9 = sVar15;
                                  if ((pdVar14[sVar15] != in_null_value) ||
                                     (NAN(pdVar14[sVar15]) || NAN(in_null_value))) break;
                                }
                              }
                              dVar35 = fdata[lVar18 + sVar16];
                              auVar26._8_8_ = 0;
                              auVar26._0_8_ = dVar35;
                              dVar24 = dVar35;
                              if ((double)CONCAT44(uVar30,uVar28) <= dVar35) {
                                dVar24 = (double)CONCAT44(uVar30,uVar28);
                              }
                              if (dVar35 <= (double)CONCAT44(uVar29,uVar27)) {
                                dVar35 = (double)CONCAT44(uVar29,uVar27);
                              }
                              if (sVar9 == sVar4) {
                                sVar19 = sVar19 + 3;
                                dVar32 = dVar35;
                                dVar33 = dVar24;
                              }
                              else {
                                sVar15 = sVar9 + 1;
                                sVar16 = sVar15;
                                if (nullcheck != 0) {
                                  sVar7 = sVar15;
                                  if (sVar4 - sVar15 != 0 && (long)sVar15 <= (long)sVar4) {
                                    sVar7 = sVar4;
                                  }
                                  for (; sVar16 = sVar7, (long)sVar15 < (long)sVar4;
                                      sVar15 = sVar15 + 1) {
                                    sVar16 = sVar15;
                                    if ((pdVar14[sVar15] != in_null_value) ||
                                       (NAN(pdVar14[sVar15]) || NAN(in_null_value))) break;
                                  }
                                }
                                dVar32 = fdata[lVar18 + sVar9];
                                uVar28 = SUB84(dVar32,0);
                                uVar30 = (undefined4)((ulong)dVar32 >> 0x20);
                                dVar33 = dVar32;
                                if (dVar24 <= dVar32) {
                                  dVar33 = dVar24;
                                }
                                if (dVar32 <= dVar35) {
                                  dVar32 = dVar35;
                                }
                                if (sVar16 == sVar4) {
                                  sVar19 = sVar19 + 4;
                                }
                                else {
                                  sVar15 = sVar16 + 1;
                                  sVar9 = sVar15;
                                  if (nullcheck != 0) {
                                    sVar7 = sVar15;
                                    if (sVar4 - sVar15 != 0 && (long)sVar15 <= (long)sVar4) {
                                      sVar7 = sVar4;
                                    }
                                    for (; sVar9 = sVar7, (long)sVar15 < (long)sVar4;
                                        sVar15 = sVar15 + 1) {
                                      sVar9 = sVar15;
                                      if ((pdVar14[sVar15] != in_null_value) ||
                                         (NAN(pdVar14[sVar15]) || NAN(in_null_value))) break;
                                    }
                                  }
                                  dVar35 = fdata[lVar18 + sVar16];
                                  uVar27 = SUB84(dVar35,0);
                                  uVar29 = (undefined4)((ulong)dVar35 >> 0x20);
                                  dVar24 = dVar35;
                                  if (dVar33 <= dVar35) {
                                    dVar24 = dVar33;
                                  }
                                  if (dVar35 <= dVar32) {
                                    dVar35 = dVar32;
                                  }
                                  if (sVar9 == sVar4) {
                                    sVar19 = sVar19 + 5;
                                    dVar32 = dVar35;
                                    dVar33 = dVar24;
                                  }
                                  else {
                                    sVar15 = sVar9 + 1;
                                    sVar16 = sVar15;
                                    if (nullcheck != 0) {
                                      sVar7 = sVar15;
                                      if (sVar4 - sVar15 != 0 && (long)sVar15 <= (long)sVar4) {
                                        sVar7 = sVar4;
                                      }
                                      for (; sVar16 = sVar7, (long)sVar15 < (long)sVar4;
                                          sVar15 = sVar15 + 1) {
                                        sVar16 = sVar15;
                                        if ((pdVar14[sVar15] != in_null_value) ||
                                           (NAN(pdVar14[sVar15]) || NAN(in_null_value))) break;
                                      }
                                    }
                                    dVar31 = fdata[lVar18 + sVar9];
                                    dVar33 = dVar31;
                                    if (dVar24 <= dVar31) {
                                      dVar33 = dVar24;
                                    }
                                    dVar32 = dVar31;
                                    if (dVar31 <= dVar35) {
                                      dVar32 = dVar35;
                                    }
                                    if (sVar16 == sVar4) {
                                      sVar19 = sVar19 + 6;
                                    }
                                    else {
                                      sVar15 = sVar16 + 1;
                                      sVar9 = sVar15;
                                      if (nullcheck != 0) {
                                        sVar7 = sVar15;
                                        if (sVar4 - sVar15 != 0 && (long)sVar15 <= (long)sVar4) {
                                          sVar7 = sVar4;
                                        }
                                        for (; sVar9 = sVar7, (long)sVar15 < (long)sVar4;
                                            sVar15 = sVar15 + 1) {
                                          sVar9 = sVar15;
                                          if ((pdVar14[sVar15] != in_null_value) ||
                                             (NAN(pdVar14[sVar15]) || NAN(in_null_value))) break;
                                        }
                                      }
                                      dVar35 = fdata[lVar18 + sVar16];
                                      dVar24 = dVar35;
                                      if (dVar33 <= dVar35) {
                                        dVar24 = dVar33;
                                      }
                                      dVar33 = dVar24;
                                      dVar24 = dVar35;
                                      if (dVar35 <= dVar32) {
                                        dVar24 = dVar32;
                                      }
                                      dVar32 = dVar24;
                                      if (sVar9 != sVar4) {
                                        dVar24 = fdata[lVar18 + sVar9];
                                        lVar20 = sVar19 + 8;
                                        dVar36 = dVar24;
                                        if (dVar33 <= dVar24) {
                                          dVar36 = dVar33;
                                        }
                                        dVar33 = dVar24;
                                        if (dVar24 <= dVar32) {
                                          dVar33 = dVar32;
                                        }
                                        lVar11 = 0;
                                        local_b0 = 0;
LAB_001a3fcb:
                                        dVar34 = (double)CONCAT44(uVar23,uVar22);
                                        uVar22 = auVar25._0_4_;
                                        uVar23 = auVar25._4_4_;
                                        dVar1 = (double)CONCAT44(uVar30,uVar28);
                                        auVar25 = auVar26;
                                        uVar28 = uVar27;
                                        uVar30 = uVar29;
                                        uVar27 = SUB84(dVar31,0);
                                        uVar29 = (int)((ulong)dVar31 >> 0x20);
                                        dVar31 = dVar35;
                                        dVar35 = dVar24;
                                        dVar32 = dVar33;
                                        dVar33 = dVar36;
                                        do {
                                          auVar26._8_8_ = 0;
                                          auVar26._0_8_ = dVar1;
                                          sVar19 = sVar9 + 1;
                                          if ((long)sVar4 <= (long)sVar19) {
LAB_001a419c:
                                            sVar19 = lVar20 + local_b0;
                                            if (local_b0 != 0) {
                                              if (local_b0 == 1) {
                                                if (lVar11 == 1) {
                                                  __ptr[local_98] = *pdVar5;
                                                  local_98 = local_98 + 1;
                                                }
                                                __base[local_68] = *pdVar6;
                                                uVar22 = SUB84(*arr,0);
                                                uVar23 = (undefined4)((ulong)*arr >> 0x20);
                                              }
                                              else {
                                                iVar3 = (int)local_b0;
                                                if (1 < lVar11) {
                                                  dVar35 = quick_select_double(pdVar5,iVar3);
                                                  __ptr[local_98] = dVar35;
                                                  local_98 = local_98 + 1;
                                                }
                                                dVar35 = quick_select_double(pdVar6,iVar3);
                                                __base[local_68] = dVar35;
                                                dVar35 = quick_select_double(arr,iVar3);
                                                uVar22 = SUB84(dVar35,0);
                                                uVar23 = (undefined4)((ulong)dVar35 >> 0x20);
                                              }
                                              __base_00[local_68] = (double)CONCAT44(uVar23,uVar22);
                                              local_68 = local_68 + 1;
                                            }
                                            goto LAB_001a4301;
                                          }
                                          if (nullcheck == 0) {
                                            dVar24 = fdata[lVar18 + sVar9 + 1];
                                            sVar9 = sVar19;
                                          }
                                          else {
                                            while( true ) {
                                              if ((long)sVar4 <= (long)sVar19) goto LAB_001a419c;
                                              dVar24 = pdVar14[sVar19];
                                              sVar9 = sVar19;
                                              if ((dVar24 != in_null_value) ||
                                                 (NAN(dVar24) || NAN(in_null_value))) break;
                                              sVar19 = sVar19 + 1;
                                            }
                                          }
                                          if ((double)CONCAT44(uVar30,uVar28) ==
                                              (double)CONCAT44(uVar29,uVar27)) {
                                            if (((double)CONCAT44(uVar29,uVar27) != dVar31) ||
                                               (NAN((double)CONCAT44(uVar29,uVar27)) || NAN(dVar31))
                                               ) goto LAB_001a4054;
                                          }
                                          else {
LAB_001a4054:
                                            pdVar5[lVar11] =
                                                 ABS((double)CONCAT44(uVar30,uVar28) - dVar31);
                                            lVar11 = lVar11 + 1;
                                          }
                                          dVar36 = dVar24;
                                          if (dVar33 <= dVar24) {
                                            dVar36 = dVar33;
                                          }
                                          dVar33 = dVar24;
                                          if (dVar24 <= dVar32) {
                                            dVar33 = dVar32;
                                          }
                                          dVar32 = auVar25._0_8_;
                                          if (((dVar32 == dVar1) &&
                                              (dVar1 == (double)CONCAT44(uVar30,uVar28))) &&
                                             ((double)CONCAT44(uVar30,uVar28) ==
                                              (double)CONCAT44(uVar29,uVar27))) {
                                            if (((double)CONCAT44(uVar29,uVar27) == dVar31) &&
                                               (!NAN((double)CONCAT44(uVar29,uVar27)) &&
                                                !NAN(dVar31))) goto LAB_001a417a;
                                          }
                                          pdVar6[local_b0] =
                                               ABS((((double)CONCAT44(uVar30,uVar28) +
                                                    (double)CONCAT44(uVar30,uVar28)) - dVar32) -
                                                   dVar31);
                                          arr[local_b0] =
                                               ABS(dVar34 + dVar31 * -4.0 +
                                                            (double)CONCAT44(uVar30,uVar28) * 6.0 +
                                                            dVar32 * -4.0 + dVar24);
                                          local_b0 = local_b0 + 1;
                                          dVar34 = (double)CONCAT44(uVar23,uVar22);
                                          uVar22 = auVar25._0_4_;
                                          uVar23 = auVar25._4_4_;
                                          dVar1 = (double)CONCAT44(uVar30,uVar28);
                                          auVar25 = auVar26;
                                          uVar28 = uVar27;
                                          uVar30 = uVar29;
                                          uVar27 = SUB84(dVar31,0);
                                          uVar29 = (int)((ulong)dVar31 >> 0x20);
                                          dVar31 = dVar35;
                                          dVar35 = dVar24;
                                          dVar32 = dVar33;
                                          dVar33 = dVar36;
                                        } while( true );
                                      }
                                      sVar19 = sVar19 + 7;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      else {
                        for (; sVar4 - sVar15 != 0; sVar15 = sVar15 + 1) {
                          if ((pdVar14[sVar15] != in_null_value) ||
                             (NAN(pdVar14[sVar15]) || NAN(in_null_value))) goto LAB_001a3cea;
                        }
                      }
LAB_001a4301:
                      pdVar14 = pdVar14 + sVar4;
                    }
                    if (local_68 == 0) {
                      dVar35 = 0.0;
                      dVar24 = 0.0;
                    }
                    else if (local_68 == 1) {
                      dVar35 = *__base;
                      dVar24 = *__base_00;
                    }
                    else {
                      qsort(__base,local_68,8,FnCompare_double);
                      qsort(__base_00,local_68,8,FnCompare_double);
                      lVar18 = (long)(local_68 - 1) / 2;
                      dVar35 = (__base[(long)local_68 / 2] + __base[lVar18]) * 0.5;
                      dVar24 = (__base_00[(long)local_68 / 2] + __base_00[lVar18]) * 0.5;
                    }
                    if (local_98 == 0) {
                      dVar31 = 0.0;
                    }
                    else if (local_98 == 1) {
                      dVar31 = *__ptr;
                    }
                    else {
                      qsort(__ptr,local_98,8,FnCompare_double);
                      dVar31 = (__ptr[(long)(local_98 - 1) / 2] + __ptr[(long)local_98 / 2]) * 0.5;
                    }
                    dVar31 = dVar31 * 1.0483579;
                    dVar35 = dVar35 * 0.6052697;
                    dVar24 = dVar24 * 0.1772048;
                    free(__base_00);
                    free(__base);
                    free(__ptr);
                    free(arr);
                    free(pdVar6);
                    free(pdVar5);
                    goto LAB_001a442d;
                  }
                  free(pdVar5);
                  free(pdVar6);
                  free(arr);
                  free(__ptr);
                  pdVar5 = __base;
                }
              }
            }
          }
          free(pdVar5);
          sVar19 = 0;
          dVar33 = 0.0;
          dVar32 = 0.0;
          goto LAB_001a4424;
        }
        sVar19 = 0;
        dVar33 = 0.0;
        dVar32 = 0.0;
      }
LAB_001a442d:
      if ((nullcheck == 0) || (sVar19 != 0)) {
        if (dVar31 == 0.0 || dVar35 <= dVar31) {
          dVar31 = dVar35;
        }
        if (((dVar24 != 0.0) || (NAN(dVar24))) && (dVar24 < dVar31)) {
          dVar31 = dVar24;
        }
      }
      else {
        dVar32 = 1.0;
        dVar33 = 0.0;
        dVar31 = 1.0;
      }
      dVar35 = dVar31 / (double)qlevel;
      if ((qlevel == 0.0) && (!NAN(qlevel))) {
        dVar35 = dVar31 * 0.25;
      }
      if ((dVar35 != 0.0) || (NAN(dVar35))) goto LAB_001a44c0;
    }
    else {
      dVar35 = (double)-qlevel;
      sVar4 = sVar8;
      if (nxpix < 5) {
        sVar4 = nypix;
      }
      sVar4 = sVar4 * nxpix;
      if ((long)sVar4 < 5) {
        sVar8 = 0;
        if ((long)sVar4 < 1) {
          sVar4 = sVar8;
        }
        dVar32 = -1.79769313486232e+308;
        dVar33 = 1.79769313486232e+308;
        sVar19 = 0;
        for (; sVar4 != sVar8; sVar8 = sVar8 + 1) {
          dVar24 = fdata[sVar8];
          uVar22 = SUB84(dVar24,0);
          uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
          if (nullcheck == 0) {
LAB_001a3952:
            dVar31 = dVar24;
            if (dVar33 <= dVar24) {
              dVar31 = dVar33;
            }
            dVar33 = dVar31;
            if (dVar24 <= dVar32) {
              uVar22 = SUB84(dVar32,0);
              uVar23 = (undefined4)((ulong)dVar32 >> 0x20);
            }
            sVar19 = sVar19 + 1;
            dVar32 = (double)CONCAT44(uVar23,uVar22);
          }
          else if ((dVar24 != in_null_value) || (NAN(dVar24) || NAN(in_null_value)))
          goto LAB_001a3952;
        }
      }
      else {
        sVar15 = 0;
        if (nypix < 1) {
          nypix = sVar15;
        }
        if (nxpix < 5) {
          nypix = sVar8;
        }
        dVar32 = -1.79769313486232e+308;
        dVar33 = 1.79769313486232e+308;
        sVar19 = 0;
        pdVar5 = fdata;
        for (; sVar15 != nypix; sVar15 = sVar15 + 1) {
          pdVar6 = fdata + sVar15 * sVar4;
          if (nullcheck == 0) {
            uVar22 = SUB84(*pdVar6,0);
            uVar23 = (undefined4)((ulong)*pdVar6 >> 0x20);
            sVar16 = sVar8;
          }
          else {
            sVar16 = 0;
            do {
              if (sVar4 - sVar16 == 0) goto LAB_001a3b98;
              dVar24 = pdVar5[sVar16];
              uVar22 = SUB84(dVar24,0);
              uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
              sVar16 = sVar16 + 1;
            } while ((dVar24 == in_null_value) && (!NAN(dVar24) && !NAN(in_null_value)));
          }
          sVar9 = sVar16;
          if (nullcheck != 0) {
            sVar7 = sVar16;
            if (sVar4 - sVar16 != 0 && (long)sVar16 <= (long)sVar4) {
              sVar7 = sVar4;
            }
            for (; sVar9 = sVar7, (long)sVar16 < (long)sVar4; sVar16 = sVar16 + 1) {
              sVar9 = sVar16;
              if ((pdVar5[sVar16] != in_null_value) || (NAN(pdVar5[sVar16]) || NAN(in_null_value)))
              break;
            }
          }
          dVar24 = (double)CONCAT44(uVar23,uVar22);
          if (dVar33 <= (double)CONCAT44(uVar23,uVar22)) {
            dVar24 = dVar33;
          }
          if ((double)CONCAT44(uVar23,uVar22) <= dVar32) {
            uVar22 = SUB84(dVar32,0);
            uVar23 = (undefined4)((ulong)dVar32 >> 0x20);
          }
          dVar33 = dVar24;
          if (sVar9 == sVar4) {
LAB_001a3a92:
            dVar32 = (double)CONCAT44(uVar23,uVar22);
          }
          else {
            sVar16 = sVar9 + 1;
            sVar7 = sVar16;
            if (nullcheck != 0) {
              sVar17 = sVar16;
              if (sVar4 - sVar16 != 0 && (long)sVar16 <= (long)sVar4) {
                sVar17 = sVar4;
              }
              for (; sVar7 = sVar17, (long)sVar16 < (long)sVar4; sVar16 = sVar16 + 1) {
                sVar7 = sVar16;
                if ((pdVar5[sVar16] != in_null_value) || (NAN(pdVar5[sVar16]) || NAN(in_null_value))
                   ) break;
              }
            }
            dVar32 = pdVar6[sVar9];
            dVar33 = dVar32;
            if (dVar24 <= dVar32) {
              dVar33 = dVar24;
            }
            if (dVar32 <= (double)CONCAT44(uVar23,uVar22)) {
              dVar32 = (double)CONCAT44(uVar23,uVar22);
            }
            if (sVar7 != sVar4) {
              sVar16 = sVar7 + 1;
              sVar9 = sVar16;
              if (nullcheck != 0) {
                sVar17 = sVar16;
                if (sVar4 - sVar16 != 0 && (long)sVar16 <= (long)sVar4) {
                  sVar17 = sVar4;
                }
                for (; sVar9 = sVar17, (long)sVar16 < (long)sVar4; sVar16 = sVar16 + 1) {
                  sVar9 = sVar16;
                  if ((pdVar5[sVar16] != in_null_value) ||
                     (NAN(pdVar5[sVar16]) || NAN(in_null_value))) break;
                }
              }
              dVar24 = pdVar6[sVar7];
              uVar22 = SUB84(dVar24,0);
              uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
              dVar31 = dVar24;
              if (dVar33 <= dVar24) {
                dVar31 = dVar33;
              }
              if (dVar24 <= dVar32) {
                uVar22 = SUB84(dVar32,0);
                uVar23 = (undefined4)((ulong)dVar32 >> 0x20);
              }
              dVar33 = dVar31;
              if (sVar9 == sVar4) goto LAB_001a3a92;
              dVar32 = pdVar6[sVar9];
              dVar33 = dVar32;
              if (dVar31 <= dVar32) {
                dVar33 = dVar31;
              }
              if (dVar32 <= (double)CONCAT44(uVar23,uVar22)) {
                dVar32 = (double)CONCAT44(uVar23,uVar22);
              }
              while (sVar16 = sVar9 + 1, (long)sVar16 < (long)sVar4) {
                if (nullcheck == 0) {
                  uVar22 = SUB84(pdVar6[sVar9 + 1],0);
                  uVar23 = (undefined4)((ulong)pdVar6[sVar9 + 1] >> 0x20);
                  sVar9 = sVar16;
                }
                else {
                  while( true ) {
                    if ((long)sVar4 <= (long)sVar16) goto LAB_001a3b94;
                    dVar24 = pdVar5[sVar16];
                    uVar22 = SUB84(dVar24,0);
                    uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
                    sVar9 = sVar16;
                    if ((dVar24 != in_null_value) || (NAN(dVar24) || NAN(in_null_value))) break;
                    sVar16 = sVar16 + 1;
                  }
                }
                dVar24 = (double)CONCAT44(uVar23,uVar22);
                if (dVar33 <= (double)CONCAT44(uVar23,uVar22)) {
                  dVar24 = dVar33;
                }
                dVar33 = dVar24;
                if ((double)CONCAT44(uVar23,uVar22) <= dVar32) {
                  uVar22 = SUB84(dVar32,0);
                  uVar23 = (undefined4)((ulong)dVar32 >> 0x20);
                }
                sVar19 = sVar19 + 1;
                dVar32 = (double)CONCAT44(uVar23,uVar22);
              }
LAB_001a3b94:
              sVar19 = sVar19 + 4;
            }
          }
LAB_001a3b98:
          pdVar5 = pdVar5 + sVar4;
        }
      }
LAB_001a44c0:
      dVar24 = (dVar32 - dVar33) / dVar35;
      if (dVar24 <= 4294967284.0) {
        if (row < 1) {
          uVar12 = 0;
          iVar3 = 0;
        }
        else {
          if ((fits_rand_value == (float *)0x0) && (iVar3 = fits_init_randoms(), iVar3 != 0)) {
            return 0x71;
          }
          uVar12 = (row - 1U) % 10000;
          iVar3 = (int)(fits_rand_value[uVar12] * 500.0);
        }
        pfVar2 = fits_rand_value;
        if (sVar19 == sVar21) {
          if (dither_method == 2) {
            dVar24 = dVar35 * 2147483637.0 + dVar33;
          }
          else if (2147483637.0 <= dVar24) {
            dVar24 = (dVar33 + dVar32) * 0.5;
          }
          else {
            dVar24 = (double)(long)(dVar33 / dVar35 + 0.5) * dVar35;
          }
          if (row < 1) {
            for (lVar18 = 0; sVar21 - lVar18 != 0; lVar18 = lVar18 + 1) {
              dVar31 = (fdata[lVar18] - dVar24) / dVar35;
              idata[lVar18] = (int)(dVar31 + *(double *)(&DAT_001cbfd0 + (ulong)(dVar31 < 0.0) * 8))
              ;
            }
          }
          else {
            for (lVar18 = 0; sVar21 - lVar18 != 0; lVar18 = lVar18 + 1) {
              dVar31 = fdata[lVar18];
              if (dither_method == 2) {
                iVar13 = -0x7ffffffe;
                if ((dVar31 != 0.0) || (NAN(dVar31))) goto LAB_001a475e;
              }
              else {
LAB_001a475e:
                dVar31 = (double)pfVar2[iVar3] + (dVar31 - dVar24) / dVar35 + -0.5;
                iVar13 = (int)(dVar31 + *(double *)(&DAT_001cbfd0 + (ulong)(dVar31 < 0.0) * 8));
              }
              idata[lVar18] = iVar13;
              iVar3 = iVar3 + 1;
              if (iVar3 == 10000) {
                uVar10 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar10;
                if (uVar10 == 10000) {
                  uVar12 = 0;
                }
                iVar3 = (int)(pfVar2[(int)uVar12] * 500.0);
              }
            }
          }
        }
        else {
          dVar24 = dVar35 * 2147483637.0 + dVar33;
          if (row < 1) {
            for (lVar18 = 0; sVar21 - lVar18 != 0; lVar18 = lVar18 + 1) {
              dVar31 = fdata[lVar18];
              if ((dVar31 != in_null_value) || (NAN(dVar31) || NAN(in_null_value))) {
                dVar31 = (dVar31 - dVar24) / dVar35;
                iVar3 = (int)(dVar31 + *(double *)(&DAT_001cbfd0 + (ulong)(dVar31 < 0.0) * 8));
              }
              else {
                iVar3 = -0x7fffffff;
              }
              idata[lVar18] = iVar3;
            }
          }
          else {
            for (lVar18 = 0; sVar21 - lVar18 != 0; lVar18 = lVar18 + 1) {
              dVar31 = fdata[lVar18];
              if ((dVar31 != in_null_value) || (NAN(dVar31) || NAN(in_null_value))) {
                if (dither_method == 2) {
                  iVar13 = -0x7ffffffe;
                  if ((dVar31 == 0.0) && (!NAN(dVar31))) goto LAB_001a460f;
                }
                dVar31 = (double)pfVar2[iVar3] + (dVar31 - dVar24) / dVar35 + -0.5;
                iVar13 = (int)(dVar31 + *(double *)(&DAT_001cbfd0 + (ulong)(dVar31 < 0.0) * 8));
              }
              else {
                iVar13 = -0x7fffffff;
              }
LAB_001a460f:
              idata[lVar18] = iVar13;
              iVar3 = iVar3 + 1;
              if (iVar3 == 10000) {
                uVar10 = (int)uVar12 + 1;
                uVar12 = (ulong)uVar10;
                if (uVar10 == 10000) {
                  uVar12 = 0;
                }
                iVar3 = (int)(pfVar2[(int)uVar12] * 500.0);
              }
            }
          }
        }
        dVar31 = (dVar33 - dVar24) / dVar35;
        uVar12 = -(ulong)(dVar31 < 0.0);
        *iminval = (int)((double)(~uVar12 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar12 >> 0x20) & 0xbfe00000) << 0x20) + dVar31);
        dVar31 = (dVar32 - dVar24) / dVar35;
        uVar12 = -(ulong)(dVar31 < 0.0);
        *imaxval = (int)((double)(~uVar12 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar12 >> 0x20) & 0xbfe00000) << 0x20) + dVar31);
        iVar3 = 1;
        goto LAB_001a482a;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
LAB_001a417a:
  lVar20 = lVar20 + 1;
  goto LAB_001a3fcb;
}

Assistant:

int fits_quantize_double (long row, double fdata[], long nxpix, long nypix, int nullcheck, 
	double in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: tile number = row number in the binary table
                       (this is only used when dithering the quantized values)
double fdata[]      i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
double in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2 = 0., noise3 = 0., noise5 = 0.;	/* MAD 2nd, 3rd, and 5th order noise values */
	double minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value;
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
       	      for (i = 0;  i < nx;  i++) {

		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
                    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
                 if (fdata[i] != in_null_value)
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 else 
                    idata[i] = NULL_VALUE;
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;

	return (1);			/* yes, data have been quantized */
}